

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O2

void __thiscall Chip8::OP_1NNN(Chip8 *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"JP 0x0");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"                 ; Jump to location");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Chip8::OP_1NNN() {
    std::cout << "JP 0x0"  << (opcode & 0x0FFFu) << "                 ; Jump to location" << std::endl;
}